

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument.cpp
# Opt level: O3

void __thiscall
sf2cute::SFInstrument::RemoveZoneIf
          (SFInstrument *this,
          function<bool_(const_std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_&)>
          *predicate)

{
  pointer puVar1;
  SFInstrumentZone *pSVar2;
  SFInstrumentZone *pSVar3;
  char cVar4;
  long lVar5;
  pointer puVar6;
  iterator iVar7;
  long lVar8;
  pointer puVar9;
  
  puVar9 = (this->zones_).
           super__Vector_base<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->zones_).
           super__Vector_base<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar8 = (long)puVar1 - (long)puVar9;
  iVar7._M_current = puVar1;
  if (0 < lVar8 >> 5) {
    lVar5 = (lVar8 >> 5) + 1;
    do {
      if (*(long *)(predicate + 0x10) == 0) goto LAB_0010c478;
      cVar4 = (**(code **)(predicate + 0x18))(predicate,puVar9);
      puVar6 = puVar9;
      if (cVar4 != '\0') goto LAB_0010c408;
      if (*(long *)(predicate + 0x10) == 0) goto LAB_0010c478;
      cVar4 = (**(code **)(predicate + 0x18))(predicate,puVar9 + 1);
      puVar6 = puVar9 + 1;
      if (cVar4 != '\0') goto LAB_0010c408;
      if (*(long *)(predicate + 0x10) == 0) goto LAB_0010c478;
      cVar4 = (**(code **)(predicate + 0x18))(predicate,puVar9 + 2);
      puVar6 = puVar9 + 2;
      if (cVar4 != '\0') goto LAB_0010c408;
      if (*(long *)(predicate + 0x10) == 0) goto LAB_0010c478;
      cVar4 = (**(code **)(predicate + 0x18))(predicate,puVar9 + 3);
      puVar6 = puVar9 + 3;
      if (cVar4 != '\0') goto LAB_0010c408;
      puVar9 = puVar9 + 4;
      lVar5 = lVar5 + -1;
      lVar8 = lVar8 + -0x20;
    } while (1 < lVar5);
  }
  lVar8 = lVar8 >> 3;
  if (lVar8 == 1) {
LAB_0010c3ea:
    if (*(long *)(predicate + 0x10) == 0) {
LAB_0010c478:
      std::__throw_bad_function_call();
    }
    cVar4 = (**(code **)(predicate + 0x18))(predicate,puVar9);
    puVar6 = puVar9;
    if (cVar4 == '\0') {
      puVar6 = puVar1;
    }
  }
  else if (lVar8 == 2) {
LAB_0010c3cd:
    if (*(long *)(predicate + 0x10) == 0) goto LAB_0010c478;
    cVar4 = (**(code **)(predicate + 0x18))(predicate,puVar9);
    puVar6 = puVar9;
    if (cVar4 == '\0') {
      puVar9 = puVar9 + 1;
      goto LAB_0010c3ea;
    }
  }
  else {
    if (lVar8 != 3) goto LAB_0010c456;
    if (*(long *)(predicate + 0x10) == 0) goto LAB_0010c478;
    cVar4 = (**(code **)(predicate + 0x18))(predicate,puVar9);
    puVar6 = puVar9;
    if (cVar4 == '\0') {
      puVar9 = puVar9 + 1;
      goto LAB_0010c3cd;
    }
  }
LAB_0010c408:
  puVar9 = puVar6;
  if (puVar6 != puVar1) {
    while (puVar9 = puVar9 + 1, iVar7._M_current = puVar6, puVar9 != puVar1) {
      if (*(long *)(predicate + 0x10) == 0) goto LAB_0010c478;
      cVar4 = (**(code **)(predicate + 0x18))(predicate,puVar9);
      if (cVar4 == '\0') {
        pSVar2 = (puVar9->_M_t).
                 super___uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
                 .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl;
        (puVar9->_M_t).
        super___uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
        ._M_t.
        super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
        .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl =
             (SFInstrumentZone *)0x0;
        pSVar3 = (puVar6->_M_t).
                 super___uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
                 .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl;
        (puVar6->_M_t).
        super___uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
        ._M_t.
        super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
        .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl = pSVar2;
        if (pSVar3 != (SFInstrumentZone *)0x0) {
          (**(code **)((long)(pSVar3->super_SFZone)._vptr_SFZone + 8))();
        }
        puVar6 = puVar6 + 1;
      }
    }
  }
LAB_0010c456:
  std::
  vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
  ::_M_erase(&this->zones_,iVar7,
             (this->zones_).
             super__Vector_base<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void SFInstrument::RemoveZoneIf(
    std::function<bool(const std::unique_ptr<SFInstrumentZone> &)> predicate) {
  zones_.erase(std::remove_if(zones_.begin(), zones_.end(),
    [&predicate](const std::unique_ptr<SFInstrumentZone> & zone) -> bool {
    if (predicate(zone)) {
      return true;
    }
    else {
      return false;
    }
  }), zones_.end());
}